

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error FT_Raccess_Get_HeaderInfo
                   (FT_Library library,FT_Stream stream,FT_Long rfork_offset,FT_Long *map_offset,
                   FT_Long *rdata_pos)

{
  bool bVar1;
  bool bVar2;
  FT_UShort FVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  FT_ULong pos;
  FT_Long type_list;
  int i;
  int allmatch;
  int allzeros;
  FT_Long rdata_len;
  FT_Long map_len;
  FT_Long map_pos;
  uchar head2 [16];
  uchar head [16];
  FT_Error local_3c;
  FT_Long *pFStack_38;
  FT_Error error;
  FT_Long *rdata_pos_local;
  FT_Long *map_offset_local;
  FT_Long rfork_offset_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  pFStack_38 = rdata_pos;
  rdata_pos_local = map_offset;
  map_offset_local = (FT_Long *)rfork_offset;
  rfork_offset_local = (FT_Long)stream;
  stream_local = (FT_Stream)library;
  local_3c = FT_Stream_Seek(stream,rfork_offset);
  library_local._4_4_ = local_3c;
  if ((local_3c == 0) &&
     (local_3c = FT_Stream_Read((FT_Stream)rfork_offset_local,head2 + 8,0x10),
     library_local._4_4_ = local_3c, local_3c == 0)) {
    if ((head2[8] < 0x80) && (((head2[0xc] < 0x80 && (head[0] < 0x80)) && (head[4] < 0x80)))) {
      *pFStack_38 = (long)(int)((uint)head2[8] << 0x18 | (uint)head2[9] << 0x10 |
                                (uint)head2[10] << 8 | (uint)head2[0xb]);
      lVar4 = (long)(int)((uint)head2[0xc] << 0x18 | (uint)head2[0xd] << 0x10 |
                          (uint)head2[0xe] << 8 | (uint)head2[0xf]);
      lVar5 = (long)(int)((uint)head[0] << 0x18 | (uint)head[1] << 0x10 | (uint)head[2] << 8 |
                         (uint)head[3]);
      lVar6 = (long)(int)((uint)head[4] << 0x18 | (uint)head[5] << 0x10 | (uint)head[6] << 8 |
                         (uint)head[7]);
      if (lVar4 == 0) {
        library_local._4_4_ = 2;
      }
      else {
        if (*pFStack_38 < lVar4) {
          if (lVar4 - lVar5 < *pFStack_38) {
            return 2;
          }
        }
        else if (*pFStack_38 - lVar6 < lVar4) {
          return 2;
        }
        if ((((0x7fffffffffffffff - lVar5 < *pFStack_38) || (0x7fffffffffffffff - lVar6 < lVar4)) ||
            ((0x7fffffffffffffff - (*pFStack_38 + lVar5) < (long)map_offset_local ||
             ((0x7fffffffffffffff - (lVar4 + lVar6) < (long)map_offset_local ||
              (*(ulong *)(rfork_offset_local + 8) <
               (ulong)((long)map_offset_local + lVar5 + *pFStack_38))))))) ||
           (*(ulong *)(rfork_offset_local + 8) < (ulong)((long)map_offset_local + lVar6 + lVar4))) {
          library_local._4_4_ = 2;
        }
        else {
          *pFStack_38 = (long)map_offset_local + *pFStack_38;
          pos = (long)map_offset_local + lVar4;
          local_3c = FT_Stream_Seek((FT_Stream)rfork_offset_local,pos);
          library_local._4_4_ = local_3c;
          if (local_3c == 0) {
            head2[7] = head[7] + '\x01';
            local_3c = FT_Stream_Read((FT_Stream)rfork_offset_local,(FT_Byte *)&map_pos,0x10);
            library_local._4_4_ = local_3c;
            if (local_3c == 0) {
              bVar1 = true;
              bVar2 = true;
              for (type_list._4_4_ = 0; type_list._4_4_ < 0x10;
                  type_list._4_4_ = type_list._4_4_ + 1) {
                if (head2[(long)type_list._4_4_ + -8] != '\0') {
                  bVar1 = false;
                }
                if (head2[(long)type_list._4_4_ + -8] != head2[(long)type_list._4_4_ + 8]) {
                  bVar2 = false;
                }
              }
              if ((bVar1) || (bVar2)) {
                local_3c = FT_Stream_Skip((FT_Stream)rfork_offset_local,8);
                FVar3 = FT_Stream_ReadUShort((FT_Stream)rfork_offset_local,&local_3c);
                lVar4 = (long)(short)FVar3;
                if (local_3c == 0) {
                  if (lVar4 < 0) {
                    library_local._4_4_ = 2;
                  }
                  else {
                    library_local._4_4_ = FT_Stream_Seek((FT_Stream)rfork_offset_local,pos + lVar4);
                    if (library_local._4_4_ == 0) {
                      *rdata_pos_local = pos + lVar4;
                      library_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  library_local._4_4_ = local_3c;
                }
              }
              else {
                library_local._4_4_ = 2;
              }
            }
          }
        }
      }
    }
    else {
      library_local._4_4_ = 2;
    }
  }
  return library_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_HeaderInfo( FT_Library  library,
                             FT_Stream   stream,
                             FT_Long     rfork_offset,
                             FT_Long    *map_offset,
                             FT_Long    *rdata_pos )
  {
    FT_Error       error;
    unsigned char  head[16], head2[16];
    FT_Long        map_pos, map_len, rdata_len;
    int            allzeros, allmatch, i;
    FT_Long        type_list;

    FT_UNUSED( library );


    error = FT_Stream_Seek( stream, (FT_ULong)rfork_offset );
    if ( error )
      return error;

    error = FT_Stream_Read( stream, (FT_Byte*)head, 16 );
    if ( error )
      return error;

    /* ensure positive values */
    if ( head[0]  >= 0x80 ||
         head[4]  >= 0x80 ||
         head[8]  >= 0x80 ||
         head[12] >= 0x80 )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos = ( head[ 0] << 24 ) |
                 ( head[ 1] << 16 ) |
                 ( head[ 2] <<  8 ) |
                   head[ 3];
    map_pos    = ( head[ 4] << 24 ) |
                 ( head[ 5] << 16 ) |
                 ( head[ 6] <<  8 ) |
                   head[ 7];
    rdata_len  = ( head[ 8] << 24 ) |
                 ( head[ 9] << 16 ) |
                 ( head[10] <<  8 ) |
                   head[11];
    map_len    = ( head[12] << 24 ) |
                 ( head[13] << 16 ) |
                 ( head[14] <<  8 ) |
                   head[15];

    /* the map must not be empty */
    if ( !map_pos )
      return FT_THROW( Unknown_File_Format );

    /* check whether rdata and map overlap */
    if ( *rdata_pos < map_pos )
    {
      if ( *rdata_pos > map_pos - rdata_len )
        return FT_THROW( Unknown_File_Format );
    }
    else
    {
      if ( map_pos > *rdata_pos - map_len )
        return FT_THROW( Unknown_File_Format );
    }

    /* check whether end of rdata or map exceeds stream size */
    if ( FT_LONG_MAX - rdata_len < *rdata_pos                               ||
         FT_LONG_MAX - map_len < map_pos                                    ||

         FT_LONG_MAX - ( *rdata_pos + rdata_len ) < rfork_offset            ||
         FT_LONG_MAX - ( map_pos + map_len ) < rfork_offset                 ||

         (FT_ULong)( rfork_offset + *rdata_pos + rdata_len ) > stream->size ||
         (FT_ULong)( rfork_offset + map_pos + map_len ) > stream->size      )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos += rfork_offset;
    map_pos    += rfork_offset;

    error = FT_Stream_Seek( stream, (FT_ULong)map_pos );
    if ( error )
      return error;

    head2[15] = (FT_Byte)( head[15] + 1 );       /* make it be different */

    error = FT_Stream_Read( stream, (FT_Byte*)head2, 16 );
    if ( error )
      return error;

    allzeros = 1;
    allmatch = 1;
    for ( i = 0; i < 16; i++ )
    {
      if ( head2[i] != 0 )
        allzeros = 0;
      if ( head2[i] != head[i] )
        allmatch = 0;
    }
    if ( !allzeros && !allmatch )
      return FT_THROW( Unknown_File_Format );

    /* If we have reached this point then it is probably a mac resource */
    /* file.  Now, does it contain any interesting resources?           */

    (void)FT_STREAM_SKIP( 4        /* skip handle to next resource map */
                          + 2      /* skip file resource number */
                          + 2 );   /* skip attributes */

    if ( FT_READ_SHORT( type_list ) )
      return error;
    if ( type_list < 0 )
      return FT_THROW( Unknown_File_Format );

    error = FT_Stream_Seek( stream, (FT_ULong)( map_pos + type_list ) );
    if ( error )
      return error;

    *map_offset = map_pos + type_list;
    return FT_Err_Ok;
  }